

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall
wabt::OptionParser::AddOption
          (OptionParser *this,char short_name,char *long_name,char *metavar,char *help,
          Callback *callback)

{
  undefined1 local_128 [8];
  Option option;
  string local_78;
  string local_58;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  std::__cxx11::string::string((string *)&option.callback._M_invoker,long_name,&local_33);
  std::__cxx11::string::string((string *)&local_78,metavar,&local_32);
  std::__cxx11::string::string((string *)&local_58,help,&local_31);
  Option::Option((Option *)local_128,short_name,(string *)&option.callback._M_invoker,&local_78,Yes,
                 &local_58,callback);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&option.callback._M_invoker);
  std::vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>>::
  emplace_back<wabt::OptionParser::Option_const&>
            ((vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>> *)
             &this->options_,(Option *)local_128);
  Option::~Option((Option *)local_128);
  return;
}

Assistant:

void OptionParser::AddOption(char short_name,
                             const char* long_name,
                             const char* metavar,
                             const char* help,
                             const Callback& callback) {
  Option option(short_name, long_name, metavar, HasArgument::Yes, help,
                callback);
  AddOption(option);
}